

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

char * ma_copy_string(char *src,ma_allocation_callbacks *pAllocationCallbacks)

{
  size_t sVar1;
  char *dst;
  
  if (src != (char *)0x0) {
    sVar1 = strlen(src);
    sVar1 = sVar1 + 1;
    if (pAllocationCallbacks == (ma_allocation_callbacks *)0x0) {
      dst = (char *)malloc(sVar1);
    }
    else {
      if (pAllocationCallbacks->onMalloc == (_func_void_ptr_size_t_void_ptr *)0x0) {
        return (char *)0x0;
      }
      dst = (char *)(*pAllocationCallbacks->onMalloc)(sVar1,pAllocationCallbacks->pUserData);
    }
    if (dst != (char *)0x0) {
      ma_strcpy_s(dst,sVar1,src);
      return dst;
    }
  }
  return (char *)0x0;
}

Assistant:

MA_API MA_NO_INLINE char* ma_copy_string(const char* src, const ma_allocation_callbacks* pAllocationCallbacks)
{
    size_t sz;
    char* dst;

    if (src == NULL) {
        return NULL;
    }

    sz = strlen(src)+1;
    dst = (char*)ma_malloc(sz, pAllocationCallbacks);
    if (dst == NULL) {
        return NULL;
    }

    ma_strcpy_s(dst, sz, src);

    return dst;
}